

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

int * __thiscall
dnet::data_types::tensor<int,_1U>::operator[](tensor<int,_1U> *this,array<unsigned_int,_1UL> *i)

{
  exception *__return_storage_ptr__;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (i->_M_elems[0] < (this->_shape)._M_elems[0]) {
    return (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + (int)(i->_M_elems[0] * (this->_facts)._M_elems[0]);
  }
  __return_storage_ptr__ = (exception *)__cxa_allocate_exception(0x40);
  std::__cxx11::string::string((string *)&local_38,"matrix",&local_59);
  std::__cxx11::string::string((string *)&local_58,"Index out of range.",&local_5a);
  misc::make_error(__return_storage_ptr__,&local_38,&local_58);
  __cxa_throw(__return_storage_ptr__,&misc::exception::typeinfo,misc::exception::~exception);
}

Assistant:

T &tensor<T, N>::operator[](const std::array<index_type, N> &i)
        {
            axes_type ii;
            for (size_t t = 0; t < i.size(); t++)
                ii[this->_axes_sort[t]] = i[t];
            if (!this->check(i)) {
                throw misc::make_error("matrix", "Index out of range.");
            }
            return this->_data[this->to_index(ii)];
        }